

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_typeSlot_getValidReferenceType(sysbvm_context_t *context,sysbvm_tuple_t typeSlot)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_typeSlot_t *typeSlotObject;
  sysbvm_tuple_t typeSlot_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(typeSlot);
  if (_Var1) {
    if (*(long *)(typeSlot + 0x38) == 0) {
      sVar2 = sysbvm_type_createMemberReferenceType(context,*(sysbvm_tuple_t *)(typeSlot + 0x30));
      *(sysbvm_tuple_t *)(typeSlot + 0x38) = sVar2;
    }
    context_local = *(sysbvm_context_t **)(typeSlot + 0x38);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_type_createMemberReferenceType(context,(context->roots).anyValueType);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_typeSlot_getValidReferenceType(sysbvm_context_t *context, sysbvm_tuple_t typeSlot)
{
    if(!sysbvm_tuple_isNonNullPointer(typeSlot))
        return sysbvm_type_createMemberReferenceType(context, context->roots.anyValueType);

    sysbvm_typeSlot_t *typeSlotObject = (sysbvm_typeSlot_t*)typeSlot;
    if(!typeSlotObject->referenceType)
        typeSlotObject->referenceType = sysbvm_type_createMemberReferenceType(context, typeSlotObject->type);

    return typeSlotObject->referenceType;
}